

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O0

bool __thiscall
QStringListModel::insertRows(QStringListModel *this,int row,int count,QModelIndex *parent)

{
  int iVar1;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  QAbstractItemModel *in_RDI;
  long in_FS_OFFSET;
  int r;
  rvalue_ref in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  QList<QString> *this_00;
  QAbstractItemModel *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int local_5c;
  bool local_39;
  QAbstractItemModel local_38 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((0 < in_EDX) && (-1 < in_ESI)) {
    iVar1 = (*(in_RDI->super_QObject)._vptr_QObject[0xf])(in_RDI,in_RCX);
    if (in_ESI <= iVar1) {
      QModelIndex::QModelIndex((QModelIndex *)0x8bb3bf);
      QAbstractItemModel::beginInsertRows
                (in_RDI,(QModelIndex *)CONCAT44(in_ESI,in_stack_ffffffffffffff78),
                 (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70);
      for (local_5c = 0; local_5c < in_EDX; local_5c = local_5c + 1) {
        this_00 = (QList<QString> *)(in_RDI + 1);
        in_stack_ffffffffffffff68 = local_38;
        QString::QString((QString *)0x8bb420);
        QList<QString>::insert
                  (this_00,CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48);
        QString::~QString((QString *)0x8bb452);
      }
      QAbstractItemModel::endInsertRows(in_stack_ffffffffffffff68);
      local_39 = true;
      goto LAB_008bb48f;
    }
  }
  local_39 = false;
LAB_008bb48f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QStringListModel::insertRows(int row, int count, const QModelIndex &parent)
{
    if (count < 1 || row < 0 || row > rowCount(parent))
        return false;

    beginInsertRows(QModelIndex(), row, row + count - 1);

    for (int r = 0; r < count; ++r)
        lst.insert(row, QString());

    endInsertRows();

    return true;
}